

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O1

Nullable<ZXing::Pdf417::Codeword> *
ZXing::Pdf417::DetectCodeword
          (Nullable<ZXing::Pdf417::Codeword> *__return_storage_ptr__,BitMatrix *image,int minColumn,
          int maxColumn,bool leftToRight,int startColumn,int imageRow,int minCodewordWidth,
          int maxCodewordWidth)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  undefined3 in_register_00000081;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ModuleBitCountType moduleBitCount;
  ModuleBitCountType result;
  undefined1 local_78 [28];
  int iStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar9 = CONCAT31(in_register_00000081,leftToRight);
  uVar8 = -uVar9 | 1;
  iVar13 = startColumn;
  iVar14 = 0;
  uVar3 = uVar9;
LAB_0017ad2b:
  uVar7 = startColumn - iVar13;
  do {
    if ((uVar3 & 1) == 0) {
      if (maxColumn <= iVar13) break;
    }
    else if (iVar13 < minColumn) break;
    bVar12 = BitMatrix::get(image,iVar13,imageRow);
    if (((bVar12 ^ (byte)uVar3) & 1) != 0) break;
    uVar2 = -uVar7;
    if (0 < (int)uVar7) {
      uVar2 = uVar7;
    }
    iVar10 = startColumn;
    if (2 < uVar2) goto LAB_0017ad90;
    iVar13 = iVar13 + uVar8;
    uVar7 = uVar7 - uVar8;
  } while( true );
  uVar8 = -uVar8;
  uVar3 = uVar3 ^ 1;
  bVar12 = iVar14 != 0;
  iVar10 = iVar13;
  iVar14 = iVar14 + 1;
  if (bVar12) goto LAB_0017ad90;
  goto LAB_0017ad2b;
LAB_0017ad90:
  stack0xffffffffffffff98 = (undefined1  [16])0x0;
  local_78._0_16_ = (undefined1  [16])0x0;
  uVar11 = 0;
  iVar13 = iVar10;
LAB_0017adb5:
  if (leftToRight) {
    if (maxColumn <= iVar13) goto LAB_0017ae00;
  }
  else if (iVar13 < minColumn) goto LAB_0017ae00;
  if (7 < uVar11) goto LAB_0017ae00;
  bVar12 = BitMatrix::get(image,iVar13,imageRow);
  if (((bVar12 ^ (byte)uVar9) & 1) == 0) {
    *(int *)(local_78 + uVar11 * 4) = *(int *)(local_78 + uVar11 * 4) + 1;
    iVar13 = iVar13 + (leftToRight - 1 | 1);
  }
  else {
    uVar11 = uVar11 + 1;
    uVar9 = (uint)(byte)((byte)uVar9 ^ 1);
  }
  goto LAB_0017adb5;
LAB_0017af38:
  __return_storage_ptr__->m_hasValue = true;
  (__return_storage_ptr__->m_value)._startX = iVar14;
  (__return_storage_ptr__->m_value)._endX = iVar10;
  (__return_storage_ptr__->m_value)._bucket =
       (((local_58._0_4_ + local_48._0_4_) - (local_58._8_4_ + local_48._8_4_)) + 9) % 9;
  (__return_storage_ptr__->m_value)._value = iVar13;
  goto LAB_0017af1e;
LAB_0017ae00:
  if (uVar11 == 8) {
LAB_0017ae28:
    iVar13 = 0;
    iVar14 = 0;
    iVar15 = 0;
    iVar16 = 0;
    lVar4 = 0;
    do {
      lVar1 = lVar4 * 4;
      iVar13 = iVar13 + *(int *)(local_78 + lVar1);
      iVar14 = iVar14 + *(int *)(local_78 + lVar1 + 4);
      iVar15 = iVar15 + *(int *)(local_78 + lVar1 + 8);
      iVar16 = iVar16 + *(int *)(local_78 + lVar1 + 0xc);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 8);
    iVar13 = iVar16 + iVar14 + iVar15 + iVar13;
    if (leftToRight) {
      iVar14 = iVar10;
      iVar10 = iVar13 + iVar10;
    }
    else {
      piVar5 = &iStack_5c;
      piVar6 = (int *)(local_78 + 4);
      do {
        iVar14 = piVar6[-1];
        piVar6[-1] = *piVar5;
        *piVar5 = iVar14;
        piVar5 = piVar5 + -1;
        bVar12 = piVar6 < piVar5;
        piVar6 = piVar6 + 1;
      } while (bVar12);
      iVar14 = iVar10 - iVar13;
    }
    if (((minCodewordWidth + -2 <= iVar13 && iVar13 <= maxCodewordWidth + 2) &&
        (uVar3 = CodewordDecoder::GetDecodedValue((array<int,_8UL> *)local_78), uVar3 != 0xffffffff)
        ) && (iVar13 = CodewordDecoder::GetCodeword(uVar3), iVar13 != -1)) {
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      iVar15 = 7;
      uVar8 = 0;
      do {
        if ((uVar3 & 1) != uVar8) {
          if (iVar15 < 1) goto LAB_0017af38;
          iVar15 = iVar15 + -1;
          uVar8 = uVar3 & 1;
        }
        *(int *)(local_58 + (long)iVar15 * 4) = *(int *)(local_58 + (long)iVar15 * 4) + 1;
        uVar3 = (int)uVar3 >> 1;
      } while( true );
    }
  }
  else {
    if (leftToRight) {
      minColumn = maxColumn;
    }
    if (minColumn == iVar13 && uVar11 == 7) goto LAB_0017ae28;
  }
  __return_storage_ptr__->m_hasValue = false;
  (__return_storage_ptr__->m_value)._startX = 0;
  (__return_storage_ptr__->m_value)._endX = 0;
  (__return_storage_ptr__->m_value)._bucket = 0;
  (__return_storage_ptr__->m_value)._value = 0;
LAB_0017af1e:
  (__return_storage_ptr__->m_value)._rowNumber = -1;
  return __return_storage_ptr__;
}

Assistant:

static Nullable<Codeword> DetectCodeword(const BitMatrix& image, int minColumn, int maxColumn, bool leftToRight, int startColumn, int imageRow, int minCodewordWidth, int maxCodewordWidth)
{
	startColumn = AdjustCodewordStartColumn(image, minColumn, maxColumn, leftToRight, startColumn, imageRow);
	// we usually know fairly exact now how long a codeword is. We should provide minimum and maximum expected length
	// and try to adjust the read pixels, e.g. remove single pixel errors or try to cut off exceeding pixels.
	// min and maxCodewordWidth should not be used as they are calculated for the whole barcode an can be inaccurate
	// for the current position
	ModuleBitCountType moduleBitCount;
	if (!GetModuleBitCount(image, minColumn, maxColumn, leftToRight, startColumn, imageRow, moduleBitCount)) {
		return nullptr;
	}
	int endColumn;
	int codewordBitCount = Reduce(moduleBitCount);
	if (leftToRight) {
		endColumn = startColumn + codewordBitCount;
	}
	else {
		std::reverse(moduleBitCount.begin(), moduleBitCount.end());
		endColumn = startColumn;
		startColumn = endColumn - codewordBitCount;
	}
	// TODO implement check for width and correction of black and white bars
	// use start (and maybe stop pattern) to determine if blackbars are wider than white bars. If so, adjust.
	// should probably done only for codewords with a lot more than 17 bits. 
	// The following fixes 10-1.png, which has wide black bars and small white bars
	//    for (int i = 0; i < moduleBitCount.length; i++) {
	//      if (i % 2 == 0) {
	//        moduleBitCount[i]--;
	//      } else {
	//        moduleBitCount[i]++;
	//      }
	//    }

	// We could also use the width of surrounding codewords for more accurate results, but this seems
	// sufficient for now
	if (!CheckCodewordSkew(codewordBitCount, minCodewordWidth, maxCodewordWidth)) {
		// We could try to use the startX and endX position of the codeword in the same column in the previous row,
		// create the bit count from it and normalize it to 8. This would help with single pixel errors.
		return nullptr;
	}

	int decodedValue = CodewordDecoder::GetDecodedValue(moduleBitCount);
	if (decodedValue != -1) {
		int codeword = CodewordDecoder::GetCodeword(decodedValue);
		if (codeword != -1) {
			return Codeword(startColumn, endColumn, GetCodewordBucketNumber(decodedValue), codeword);
		}
	}
	return nullptr;
}